

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.h
# Opt level: O3

void avl_balance_tree(avl_node_t **node)

{
  avl_node_t *parent;
  avl_node_t *paVar1;
  avl_node_t *paVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  paVar2 = *node;
  uVar5 = 0;
  uVar4 = 0;
  paVar1 = paVar2->left;
  if (paVar1 != (avl_node_t *)0x0) {
    uVar5 = paVar1->height;
  }
  parent = paVar2->right;
  if (parent != (avl_node_t *)0x0) {
    uVar4 = parent->height;
  }
  uVar3 = uVar4;
  if ((int)uVar4 < (int)uVar5) {
    uVar3 = uVar5;
  }
  paVar2->height = uVar3 + 1;
  if ((int)(uVar5 - uVar4) < 2) {
    if (-2 < (int)(uVar5 - uVar4)) {
      return;
    }
    if (parent == (avl_node_t *)0x0) {
LAB_001125e7:
      paVar1 = avl_rotate_LL(parent);
      paVar2->right = paVar1;
    }
    else {
      uVar5 = 0;
      uVar4 = 0;
      if (parent->left != (avl_node *)0x0) {
        uVar5 = parent->left->height;
      }
      if (parent->right != (avl_node *)0x0) {
        uVar4 = parent->right->height;
      }
      if ((int)uVar4 <= (int)uVar5) goto LAB_001125e7;
    }
    paVar2 = avl_rotate_RR(paVar2);
    goto LAB_001125fb;
  }
  if (paVar1 == (avl_node_t *)0x0) {
LAB_001125a9:
    paVar1 = avl_rotate_RR(paVar1);
    paVar2->left = paVar1;
  }
  else {
    uVar5 = 0;
    uVar4 = 0;
    if (paVar1->left != (avl_node *)0x0) {
      uVar5 = paVar1->left->height;
    }
    if (paVar1->right != (avl_node *)0x0) {
      uVar4 = paVar1->right->height;
    }
    if ((int)uVar5 <= (int)uVar4) goto LAB_001125a9;
  }
  paVar2 = avl_rotate_LL(paVar2);
LAB_001125fb:
  *node = paVar2;
  return;
}

Assistant:

static void
avl_balance_tree(avl_node_t **node)
{
    int factor = avl_update_height_get_balance(*node);

    if (factor > 1) {
        if (avl_get_balance((*node)->left) > 0) *node = avl_rotate_LL(*node);
        else *node = avl_rotate_LR(*node);
    } else if (factor < -1) {
        if (avl_get_balance((*node)->right) < 0) *node = avl_rotate_RR(*node);
        else *node = avl_rotate_RL(*node);
    }
}